

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O1

void test_bson_iter_overwrite_bool(void)

{
  char cVar1;
  int iVar2;
  bson_t *pbVar3;
  undefined1 *puVar4;
  char *pcVar5;
  ulong uVar6;
  undefined1 *puVar7;
  undefined8 *puVar8;
  bson_t *pbVar9;
  bson_t *pbVar10;
  bson_t *pbVar11;
  TestSuite *suite;
  bson_t *pbVar12;
  undefined1 auVar13 [16];
  bson_iter_t iter;
  bson_t b;
  undefined1 auStack_2018 [4104];
  bson_t *pbStack_1010;
  code *pcStack_1008;
  undefined8 uStack_f90;
  undefined1 uStack_f88;
  TestSuite aTStack_f80 [5];
  code *pcStack_e88;
  int *piStack_e10;
  int iStack_e08;
  undefined1 auStack_e04 [4];
  undefined1 auStack_e00 [232];
  bson_t *pbStack_d18;
  undefined1 *puStack_d10;
  code *pcStack_d08;
  bson_t bStack_d00;
  bson_t abStack_c80 [2];
  undefined8 uStack_b48;
  char *pcStack_b40;
  bson_t *pbStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  bson_t *pbStack_b20;
  char *pcStack_b18;
  code *pcStack_b08;
  undefined1 auStack_b00 [128];
  undefined1 auStack_a80 [232];
  undefined1 *puStack_998;
  undefined1 *puStack_990;
  code *pcStack_988;
  undefined1 auStack_980 [128];
  undefined1 auStack_900 [368];
  undefined1 *puStack_790;
  code *pcStack_788;
  undefined1 auStack_780 [128];
  undefined1 auStack_700 [128];
  undefined1 auStack_680 [128];
  undefined1 auStack_600 [368];
  undefined8 *puStack_490;
  code *apcStack_488 [13];
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined1 auStack_410 [16];
  undefined8 auStack_400 [14];
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 auStack_380 [360];
  undefined1 *puStack_218;
  code *pcStack_208;
  undefined1 auStack_200 [128];
  undefined1 local_180 [368];
  
  puVar7 = local_180;
  pcStack_208 = (code *)0x12b4cf;
  bson_init(puVar7);
  pcStack_208 = (code *)0x12b4e8;
  cVar1 = bson_append_bool(puVar7,"key",0xffffffff,1);
  if (cVar1 == '\0') {
    pcStack_208 = (code *)0x12b56e;
    test_bson_iter_overwrite_bool_cold_1();
LAB_0012b56e:
    pcStack_208 = (code *)0x12b573;
    test_bson_iter_overwrite_bool_cold_2();
LAB_0012b573:
    pcStack_208 = (code *)0x12b578;
    test_bson_iter_overwrite_bool_cold_3();
LAB_0012b578:
    pcStack_208 = (code *)0x12b57d;
    test_bson_iter_overwrite_bool_cold_4();
LAB_0012b57d:
    pcStack_208 = (code *)0x12b582;
    test_bson_iter_overwrite_bool_cold_5();
  }
  else {
    pcStack_208 = (code *)0x12b503;
    cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
    if (cVar1 == '\0') goto LAB_0012b56e;
    pcStack_208 = (code *)0x12b50f;
    iVar2 = bson_iter_type(auStack_200);
    if (iVar2 != 8) goto LAB_0012b573;
    pcStack_208 = (code *)0x12b521;
    bson_iter_overwrite_bool(auStack_200,0);
    pcStack_208 = (code *)0x12b538;
    cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
    puVar7 = auStack_200;
    if (cVar1 == '\0') goto LAB_0012b578;
    pcStack_208 = (code *)0x12b544;
    iVar2 = bson_iter_type(auStack_200);
    puVar7 = auStack_200;
    if (iVar2 != 8) goto LAB_0012b57d;
    pcStack_208 = (code *)0x12b551;
    cVar1 = bson_iter_bool(auStack_200);
    puVar7 = auStack_200;
    if (cVar1 == '\0') {
      pcStack_208 = (code *)0x12b562;
      bson_destroy(local_180);
      return;
    }
  }
  pcStack_208 = test_bson_iter_overwrite_decimal128;
  test_bson_iter_overwrite_bool_cold_6();
  puVar8 = &uStack_390;
  uStack_388 = 0;
  uStack_390 = 1;
  uStack_418 = 0;
  uStack_420 = 2;
  puVar4 = auStack_380;
  apcStack_488[0] = (code *)0x12b5cc;
  puStack_218 = puVar7;
  pcStack_208 = (code *)&stack0xfffffffffffffff8;
  bson_init(puVar4);
  apcStack_488[0] = (code *)0x12b5e3;
  cVar1 = bson_append_decimal128(puVar4,"key",0xffffffff,puVar8);
  if (cVar1 == '\0') {
    apcStack_488[0] = (code *)0x12b6b3;
    test_bson_iter_overwrite_decimal128_cold_1();
LAB_0012b6b3:
    apcStack_488[0] = (code *)0x12b6b8;
    test_bson_iter_overwrite_decimal128_cold_2();
LAB_0012b6b8:
    apcStack_488[0] = (code *)0x12b6bd;
    test_bson_iter_overwrite_decimal128_cold_3();
LAB_0012b6bd:
    apcStack_488[0] = (code *)0x12b6c2;
    test_bson_iter_overwrite_decimal128_cold_4();
LAB_0012b6c2:
    apcStack_488[0] = (code *)0x12b6c7;
    test_bson_iter_overwrite_decimal128_cold_5();
LAB_0012b6c7:
    apcStack_488[0] = (code *)0x12b6cc;
    test_bson_iter_overwrite_decimal128_cold_6();
  }
  else {
    apcStack_488[0] = (code *)0x12b607;
    cVar1 = bson_iter_init_find(auStack_400,auStack_380,"key");
    if (cVar1 == '\0') goto LAB_0012b6b3;
    apcStack_488[0] = (code *)0x12b61c;
    iVar2 = bson_iter_type(auStack_400);
    if (iVar2 != 0x13) goto LAB_0012b6b8;
    puVar8 = auStack_400;
    apcStack_488[0] = (code *)0x12b63a;
    bson_iter_overwrite_decimal128(puVar8,&uStack_420);
    apcStack_488[0] = (code *)0x12b651;
    cVar1 = bson_iter_init_find(puVar8,auStack_380,"key");
    if (cVar1 == '\0') goto LAB_0012b6bd;
    apcStack_488[0] = (code *)0x12b662;
    iVar2 = bson_iter_type(auStack_400);
    if (iVar2 != 0x13) goto LAB_0012b6c2;
    apcStack_488[0] = (code *)0x12b679;
    cVar1 = bson_iter_decimal128(auStack_400,auStack_410);
    if (cVar1 == '\0') goto LAB_0012b6c7;
    auVar13[0] = -((char)uStack_420 == auStack_410[0]);
    auVar13[1] = -(uStack_420._1_1_ == auStack_410[1]);
    auVar13[2] = -(uStack_420._2_1_ == auStack_410[2]);
    auVar13[3] = -(uStack_420._3_1_ == auStack_410[3]);
    auVar13[4] = -(uStack_420._4_1_ == auStack_410[4]);
    auVar13[5] = -(uStack_420._5_1_ == auStack_410[5]);
    auVar13[6] = -(uStack_420._6_1_ == auStack_410[6]);
    auVar13[7] = -(uStack_420._7_1_ == auStack_410[7]);
    auVar13[8] = -((char)uStack_418 == auStack_410[8]);
    auVar13[9] = -(uStack_418._1_1_ == auStack_410[9]);
    auVar13[10] = -(uStack_418._2_1_ == auStack_410[10]);
    auVar13[0xb] = -(uStack_418._3_1_ == auStack_410[0xb]);
    auVar13[0xc] = -(uStack_418._4_1_ == auStack_410[0xc]);
    auVar13[0xd] = -(uStack_418._5_1_ == auStack_410[0xd]);
    auVar13[0xe] = -(uStack_418._6_1_ == auStack_410[0xe]);
    auVar13[0xf] = -(uStack_418._7_1_ == auStack_410[0xf]);
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf
                ) == 0xffff) {
      apcStack_488[0] = (code *)0x12b6a5;
      bson_destroy(auStack_380);
      return;
    }
  }
  apcStack_488[0] = test_bson_iter_recurse;
  test_bson_iter_overwrite_decimal128_cold_7();
  pcStack_788 = (code *)0x12b6ee;
  puStack_490 = puVar8;
  apcStack_488[0] = (code *)&pcStack_208;
  bson_init(auStack_600);
  pcStack_788 = (code *)0x12b6fe;
  bson_init(auStack_700);
  pcStack_788 = (code *)0x12b714;
  cVar1 = bson_append_int32(auStack_700,"0",1,0);
  if (cVar1 == '\0') {
    pcStack_788 = (code *)0x12b84e;
    test_bson_iter_recurse_cold_1();
LAB_0012b84e:
    pcStack_788 = (code *)0x12b853;
    test_bson_iter_recurse_cold_2();
LAB_0012b853:
    pcStack_788 = (code *)0x12b858;
    test_bson_iter_recurse_cold_3();
LAB_0012b858:
    pcStack_788 = (code *)0x12b85d;
    test_bson_iter_recurse_cold_4();
LAB_0012b85d:
    pcStack_788 = (code *)0x12b862;
    test_bson_iter_recurse_cold_5();
LAB_0012b862:
    pcStack_788 = (code *)0x12b867;
    test_bson_iter_recurse_cold_6();
LAB_0012b867:
    pcStack_788 = (code *)0x12b86c;
    test_bson_iter_recurse_cold_7();
LAB_0012b86c:
    pcStack_788 = (code *)0x12b871;
    test_bson_iter_recurse_cold_8();
LAB_0012b871:
    pcStack_788 = (code *)0x12b876;
    test_bson_iter_recurse_cold_9();
LAB_0012b876:
    pcStack_788 = (code *)0x12b87b;
    test_bson_iter_recurse_cold_10();
  }
  else {
    pcStack_788 = (code *)0x12b73a;
    cVar1 = bson_append_int32(auStack_700,"1",1,1);
    if (cVar1 == '\0') goto LAB_0012b84e;
    pcStack_788 = (code *)0x12b760;
    cVar1 = bson_append_int32(auStack_700,"2",1,2);
    if (cVar1 == '\0') goto LAB_0012b853;
    pcStack_788 = (code *)0x12b789;
    cVar1 = bson_append_array(auStack_600,"key",0xffffffff,auStack_700);
    if (cVar1 == '\0') goto LAB_0012b858;
    pcStack_788 = (code *)0x12b7ad;
    cVar1 = bson_iter_init_find(auStack_680,auStack_600,"key");
    if (cVar1 == '\0') goto LAB_0012b85d;
    pcStack_788 = (code *)0x12b7c2;
    iVar2 = bson_iter_type(auStack_680);
    if (iVar2 != 4) goto LAB_0012b862;
    pcStack_788 = (code *)0x12b7db;
    cVar1 = bson_iter_recurse(auStack_680,auStack_780);
    if (cVar1 == '\0') goto LAB_0012b867;
    pcStack_788 = (code *)0x12b7f2;
    cVar1 = bson_iter_find(auStack_780,"0");
    if (cVar1 == '\0') goto LAB_0012b86c;
    pcStack_788 = (code *)0x12b805;
    cVar1 = bson_iter_find(auStack_780,"1");
    if (cVar1 == '\0') goto LAB_0012b871;
    pcStack_788 = (code *)0x12b818;
    cVar1 = bson_iter_find(auStack_780,"2");
    if (cVar1 == '\0') goto LAB_0012b876;
    pcStack_788 = (code *)0x12b824;
    cVar1 = bson_iter_next(auStack_780);
    if (cVar1 == '\0') {
      pcStack_788 = (code *)0x12b835;
      bson_destroy(auStack_600);
      pcStack_788 = (code *)0x12b842;
      bson_destroy(auStack_700);
      return;
    }
  }
  pcStack_788 = test_bson_iter_init_find_case;
  test_bson_iter_recurse_cold_11();
  pcStack_988 = (code *)0x12b8a0;
  puStack_790 = auStack_700;
  pcStack_788 = (code *)apcStack_488;
  bson_init(auStack_900);
  pcStack_988 = (code *)0x12b8b9;
  cVar1 = bson_append_int32(auStack_900,"FOO",0xffffffff,0x4d2);
  if (cVar1 == '\0') {
    pcStack_988 = (code *)0x12b900;
    test_bson_iter_init_find_case_cold_1();
LAB_0012b900:
    pcStack_988 = (code *)0x12b905;
    test_bson_iter_init_find_case_cold_2();
  }
  else {
    pcStack_988 = (code *)0x12b8d4;
    cVar1 = bson_iter_init_find_case(auStack_980,auStack_900,"foo");
    if (cVar1 == '\0') goto LAB_0012b900;
    pcStack_988 = (code *)0x12b8e0;
    iVar2 = bson_iter_int32(auStack_980);
    if (iVar2 == 0x4d2) {
      pcStack_988 = (code *)0x12b8f4;
      bson_destroy(auStack_900);
      return;
    }
  }
  pcStack_988 = test_bson_iter_find_descendant;
  test_bson_iter_init_find_case_cold_3();
  pcStack_b08 = (code *)0x12b928;
  puStack_998 = auStack_900;
  puStack_990 = puVar4;
  pcStack_988 = (code *)&pcStack_788;
  pbVar3 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/dotkey.bson"
                   );
  pcStack_b08 = (code *)0x12b93b;
  cVar1 = bson_iter_init(auStack_a80,pbVar3);
  if (cVar1 == '\0') {
    pcStack_b08 = (code *)0x12bb6c;
    test_bson_iter_find_descendant_cold_1();
LAB_0012bb6c:
    pcStack_b08 = (code *)0x12bb71;
    test_bson_iter_find_descendant_cold_2();
LAB_0012bb71:
    pcStack_b08 = (code *)0x12bb76;
    test_bson_iter_find_descendant_cold_3();
LAB_0012bb76:
    pcStack_b08 = (code *)0x12bb7b;
    test_bson_iter_find_descendant_cold_4();
LAB_0012bb7b:
    pcStack_b08 = (code *)0x12bb80;
    test_bson_iter_find_descendant_cold_5();
LAB_0012bb80:
    pcStack_b08 = (code *)0x12bb85;
    test_bson_iter_find_descendant_cold_6();
LAB_0012bb85:
    pcStack_b08 = (code *)0x12bb8a;
    test_bson_iter_find_descendant_cold_7();
LAB_0012bb8a:
    pcStack_b08 = (code *)0x12bb8f;
    test_bson_iter_find_descendant_cold_8();
LAB_0012bb8f:
    pcStack_b08 = (code *)0x12bb94;
    test_bson_iter_find_descendant_cold_9();
LAB_0012bb94:
    pcStack_b08 = (code *)0x12bb99;
    test_bson_iter_find_descendant_cold_10();
LAB_0012bb99:
    pcStack_b08 = (code *)0x12bb9e;
    test_bson_iter_find_descendant_cold_11();
LAB_0012bb9e:
    pcStack_b08 = (code *)0x12bba3;
    test_bson_iter_find_descendant_cold_12();
LAB_0012bba3:
    pcStack_b08 = (code *)0x12bba8;
    test_bson_iter_find_descendant_cold_13();
  }
  else {
    pcStack_b08 = (code *)0x12b95a;
    cVar1 = bson_iter_find_descendant(auStack_a80,"a.b.c.0",auStack_b00);
    if (cVar1 == '\0') goto LAB_0012bb6c;
    pcStack_b08 = (code *)0x12b96a;
    iVar2 = bson_iter_type(auStack_b00);
    if (iVar2 != 0x10) goto LAB_0012bb71;
    pcStack_b08 = (code *)0x12b97b;
    iVar2 = bson_iter_int32(auStack_b00);
    if (iVar2 != 1) goto LAB_0012bb76;
    pcStack_b08 = (code *)0x12b98c;
    bson_destroy(pbVar3);
    pcStack_b08 = (code *)0x12b991;
    pbVar3 = (bson_t *)bson_bcon_magic();
    pcStack_b08 = (code *)0x0;
    pcStack_b18 = "]";
    pbStack_b20 = (bson_t *)0x148ce7;
    uStack_b28 = 1;
    uStack_b30 = 0xf;
    pcStack_b40 = "baz";
    uStack_b48 = 0x12b9e0;
    pbStack_b38 = pbVar3;
    puVar4 = (undefined1 *)bcon_new(0,"foo","{","bar","[","{");
    pcStack_b08 = (code *)0x12b9f7;
    cVar1 = bson_iter_init(auStack_a80,puVar4);
    if (cVar1 == '\0') goto LAB_0012bb7b;
    pcStack_b08 = (code *)0x12ba16;
    cVar1 = bson_iter_find_descendant(auStack_a80,"foo.bar.0.baz",auStack_b00);
    if (cVar1 == '\0') goto LAB_0012bb80;
    pcStack_b08 = (code *)0x12ba26;
    iVar2 = bson_iter_type(auStack_b00);
    if (iVar2 != 0x10) goto LAB_0012bb85;
    pcStack_b08 = (code *)0x12ba37;
    iVar2 = bson_iter_int32(auStack_b00);
    if (iVar2 != 1) goto LAB_0012bb8a;
    pcStack_b08 = (code *)0x12ba48;
    bson_destroy(puVar4);
    pcStack_b08 = (code *)0x0;
    pcStack_b18 = (char *)0xf;
    uStack_b28 = 0x12ba74;
    pbStack_b20 = pbVar3;
    puVar4 = (undefined1 *)bcon_new(0,"nModified",pbVar3,0xf,1,"n");
    pcStack_b08 = (code *)0x12ba8b;
    cVar1 = bson_iter_init(auStack_a80,puVar4);
    if (cVar1 == '\0') goto LAB_0012bb8f;
    pcStack_b08 = (code *)0x12baaa;
    cVar1 = bson_iter_find_descendant(auStack_a80,"n",auStack_b00);
    if (cVar1 == '\0') goto LAB_0012bb94;
    pcStack_b08 = (code *)0x12baba;
    pcVar5 = (char *)bson_iter_key(auStack_b00);
    pcStack_b08 = (code *)0x12bac9;
    iVar2 = strcmp(pcVar5,"n");
    if (iVar2 != 0) goto LAB_0012bb99;
    pcStack_b08 = (code *)0x12bad9;
    bson_destroy(puVar4);
    pcStack_b08 = (code *)0x0;
    pcStack_b18 = (char *)0xf;
    uStack_b28 = 0x12bb05;
    pbStack_b20 = pbVar3;
    pbVar3 = (bson_t *)bcon_new(0,"",pbVar3,0xf,1,"n");
    pcStack_b08 = (code *)0x12bb1c;
    cVar1 = bson_iter_init(auStack_a80,pbVar3);
    if (cVar1 == '\0') goto LAB_0012bb9e;
    pcStack_b08 = (code *)0x12bb37;
    cVar1 = bson_iter_find_descendant(auStack_a80,"n",auStack_b00);
    if (cVar1 == '\0') goto LAB_0012bba3;
    pcStack_b08 = (code *)0x12bb43;
    pcVar5 = (char *)bson_iter_key(auStack_b00);
    pcStack_b08 = (code *)0x12bb52;
    iVar2 = strcmp(pcVar5,"n");
    if (iVar2 == 0) {
      pcStack_b08 = (code *)0x12bb5e;
      bson_destroy(pbVar3);
      return;
    }
  }
  pcStack_b08 = test_bson_iter_as_bool;
  test_bson_iter_find_descendant_cold_14();
  pbVar10 = &bStack_d00;
  pbVar11 = &bStack_d00;
  pbVar12 = &bStack_d00;
  pbVar9 = abStack_c80;
  pcStack_d08 = (code *)0x12bbd1;
  pbStack_b20 = pbVar3;
  pcStack_b18 = puVar4;
  pcStack_b08 = (code *)&pcStack_988;
  bson_init(pbVar9);
  pcStack_d08 = (code *)0x12bbea;
  bson_append_int32(pbVar9,"int32[true]",0xffffffff,1);
  pcStack_d08 = (code *)0x12bc00;
  bson_append_int32(pbVar9,"int32[false]",0xffffffff,0);
  pcStack_d08 = (code *)0x12bc1c;
  bson_append_int64(pbVar9,"int64[true]",0xffffffff,1);
  pcStack_d08 = (code *)0x12bc35;
  bson_append_int64(pbVar9,"int64[false]",0xffffffff,0);
  pcStack_d08 = (code *)0x12bc4d;
  bson_append_double(0x3ff0000000000000,pbVar9,"int64[true]",0xffffffff);
  pcStack_d08 = (code *)0x12bc60;
  bson_append_double(pbVar9,"int64[false]",0xffffffff);
  pcStack_d08 = (code *)0x12bc6e;
  bson_iter_init(&bStack_d00,pbVar9);
  pcStack_d08 = (code *)0x12bc76;
  bson_iter_next(&bStack_d00);
  pcStack_d08 = (code *)0x12bc7e;
  cVar1 = bson_iter_as_bool(&bStack_d00);
  if (cVar1 == '\0') {
    pcStack_d08 = (code *)0x12bd16;
    test_bson_iter_as_bool_cold_1();
LAB_0012bd16:
    pcStack_d08 = (code *)0x12bd1b;
    test_bson_iter_as_bool_cold_6();
LAB_0012bd1b:
    pbVar10 = pbVar9;
    pcStack_d08 = (code *)0x12bd20;
    test_bson_iter_as_bool_cold_2();
LAB_0012bd20:
    pcStack_d08 = (code *)0x12bd25;
    test_bson_iter_as_bool_cold_5();
LAB_0012bd25:
    pbVar11 = pbVar10;
    pcStack_d08 = (code *)0x12bd2a;
    test_bson_iter_as_bool_cold_3();
  }
  else {
    pcStack_d08 = (code *)0x12bc91;
    bson_iter_next(&bStack_d00);
    pcStack_d08 = (code *)0x12bc99;
    cVar1 = bson_iter_as_bool(&bStack_d00);
    pbVar9 = &bStack_d00;
    if (cVar1 != '\0') goto LAB_0012bd16;
    pcStack_d08 = (code *)0x12bca8;
    bson_iter_next(&bStack_d00);
    pcStack_d08 = (code *)0x12bcb0;
    cVar1 = bson_iter_as_bool(&bStack_d00);
    pbVar9 = &bStack_d00;
    if (cVar1 == '\0') goto LAB_0012bd1b;
    pcStack_d08 = (code *)0x12bcbf;
    bson_iter_next(&bStack_d00);
    pcStack_d08 = (code *)0x12bcc7;
    cVar1 = bson_iter_as_bool(&bStack_d00);
    if (cVar1 != '\0') goto LAB_0012bd20;
    pcStack_d08 = (code *)0x12bcd6;
    bson_iter_next(&bStack_d00);
    pcStack_d08 = (code *)0x12bcde;
    cVar1 = bson_iter_as_bool(&bStack_d00);
    pbVar10 = &bStack_d00;
    if (cVar1 == '\0') goto LAB_0012bd25;
    pcStack_d08 = (code *)0x12bced;
    bson_iter_next(&bStack_d00);
    pcStack_d08 = (code *)0x12bcf5;
    cVar1 = bson_iter_as_bool(&bStack_d00);
    if (cVar1 == '\0') {
      pcStack_d08 = (code *)0x12bd06;
      bson_destroy(abStack_c80);
      return;
    }
  }
  pcStack_d08 = test_bson_iter_binary_deprecated;
  test_bson_iter_as_bool_cold_4();
  pcStack_e88 = (code *)0x12bd4d;
  pbStack_d18 = pbVar11;
  puStack_d10 = (undefined1 *)&bStack_d00;
  pcStack_d08 = (code *)&pcStack_b08;
  pbVar3 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/binary_deprecated.bson"
                   );
  if (pbVar3 == (bson_t *)0x0) {
    pcStack_e88 = (code *)0x12bdc2;
    test_bson_iter_binary_deprecated_cold_5();
LAB_0012bdc2:
    pcStack_e88 = (code *)0x12bdc7;
    test_bson_iter_binary_deprecated_cold_1();
LAB_0012bdc7:
    pcStack_e88 = (code *)0x12bdcc;
    test_bson_iter_binary_deprecated_cold_2();
LAB_0012bdcc:
    pcStack_e88 = (code *)0x12bdd1;
    test_bson_iter_binary_deprecated_cold_3();
  }
  else {
    pcStack_e88 = (code *)0x12bd65;
    cVar1 = bson_iter_init(auStack_e00,pbVar3);
    pbVar11 = pbVar3;
    if (cVar1 == '\0') goto LAB_0012bdc2;
    pcStack_e88 = (code *)0x12bd76;
    cVar1 = bson_iter_next(auStack_e00);
    if (cVar1 == '\0') goto LAB_0012bdc7;
    pbVar12 = (bson_t *)&iStack_e08;
    pcStack_e88 = (code *)0x12bd99;
    bson_iter_binary(auStack_e00,auStack_e04,pbVar12,&piStack_e10);
    if (iStack_e08 != 4) goto LAB_0012bdcc;
    if (*piStack_e10 == 0x34333231) {
      pcStack_e88 = (code *)0x12bdb4;
      bson_destroy(pbVar3);
      return;
    }
  }
  pcStack_e88 = test_bson_iter_from_data;
  test_bson_iter_binary_deprecated_cold_4();
  uStack_f90 = 0x100620800000009;
  uStack_f88 = 0;
  suite = aTStack_f80;
  pcStack_1008 = (code *)0x12be0d;
  pcStack_e88 = (code *)&pcStack_d08;
  cVar1 = bson_iter_init_from_data(suite,&uStack_f90,9);
  if (cVar1 == '\0') {
    pcStack_1008 = (code *)0x12be4f;
    test_bson_iter_from_data_cold_1();
LAB_0012be4f:
    pcStack_1008 = (code *)0x12be54;
    test_bson_iter_from_data_cold_2();
LAB_0012be54:
    pcStack_1008 = (code *)0x12be59;
    test_bson_iter_from_data_cold_3();
  }
  else {
    suite = aTStack_f80;
    pcStack_1008 = (code *)0x12be1e;
    cVar1 = bson_iter_next();
    if (cVar1 == '\0') goto LAB_0012be4f;
    suite = aTStack_f80;
    pcStack_1008 = (code *)0x12be2f;
    iVar2 = bson_iter_type();
    if (iVar2 != 8) goto LAB_0012be54;
    suite = aTStack_f80;
    pcStack_1008 = (code *)0x12be41;
    cVar1 = bson_iter_bool();
    if (cVar1 != '\0') {
      return;
    }
  }
  pcStack_1008 = get_bson;
  test_bson_iter_from_data_cold_4();
  pbStack_1010 = pbVar11;
  pcStack_1008 = (code *)pbVar12;
  iVar2 = open((char *)suite,0);
  if (iVar2 != -1) {
    uVar6 = read(iVar2,auStack_2018,0x1000);
    if ((long)uVar6 < 0) goto LAB_0012bec0;
    if (uVar6 != 0) {
      bson_new_from_data(auStack_2018,uVar6 & 0xffffffff);
      close(iVar2);
      return;
    }
    get_bson_cold_1();
  }
  get_bson_cold_3();
LAB_0012bec0:
  get_bson_cold_2();
  TestSuite_Add(suite,"/bson/as_json/x1000",test_bson_as_json_x1000);
  TestSuite_Add(suite,"/bson/as_json/multi",test_bson_as_json_multi);
  TestSuite_Add(suite,"/bson/as_json/string",test_bson_as_json_string);
  TestSuite_Add(suite,"/bson/as_json/int32",test_bson_as_json_int32);
  TestSuite_Add(suite,"/bson/as_json/int64",test_bson_as_json_int64);
  TestSuite_Add(suite,"/bson/as_json/double",test_bson_as_json_double);
  TestSuite_Add(suite,"/bson/as_json/double/nonfinite",test_bson_as_json_double_nonfinite);
  TestSuite_Add(suite,"/bson/as_json/code",test_bson_as_json_code);
  TestSuite_Add(suite,"/bson/as_json/date_time",test_bson_as_json_date_time);
  TestSuite_Add(suite,"/bson/as_json/regex",test_bson_as_json_regex);
  TestSuite_Add(suite,"/bson/as_json/symbol",test_bson_as_json_symbol);
  TestSuite_Add(suite,"/bson/as_json/utf8",test_bson_as_json_utf8);
  TestSuite_Add(suite,"/bson/as_json/dbpointer",test_bson_as_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_canonical_extended_json/dbpointer",
                test_bson_as_canonical_extended_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_json/stack_overflow",test_bson_as_json_stack_overflow);
  TestSuite_Add(suite,"/bson/as_json/corrupt",test_bson_corrupt);
  TestSuite_Add(suite,"/bson/as_json/corrupt_utf8",test_bson_corrupt_utf8);
  TestSuite_Add(suite,"/bson/as_json/corrupt_binary",test_bson_corrupt_binary);
  TestSuite_Add(suite,"/bson/as_json_spacing",test_bson_as_json_spacing);
  TestSuite_Add(suite,"/bson/array_as_json",test_bson_array_as_json);
  TestSuite_Add(suite,"/bson/json/allow_multiple",test_bson_json_allow_multiple);
  TestSuite_Add(suite,"/bson/json/read/buffering",test_bson_json_read_buffering);
  TestSuite_Add(suite,"/bson/json/read",test_bson_json_read);
  TestSuite_Add(suite,"/bson/json/inc",test_bson_json_inc);
  TestSuite_Add(suite,"/bson/json/array",test_bson_json_array);
  TestSuite_Add(suite,"/bson/json/array/single",test_bson_json_array_single);
  TestSuite_Add(suite,"/bson/json/array/int64",test_bson_json_array_int64);
  TestSuite_Add(suite,"/bson/json/array/subdoc",test_bson_json_array_subdoc);
  TestSuite_Add(suite,"/bson/json/date",test_bson_json_date);
  TestSuite_Add(suite,"/bson/json/date/legacy",test_bson_json_date_legacy);
  TestSuite_Add(suite,"/bson/json/date/long",test_bson_json_date_numberlong);
  TestSuite_Add(suite,"/bson/json/timestamp",test_bson_json_timestamp);
  TestSuite_Add(suite,"/bson/json/read/empty",test_bson_json_read_empty);
  TestSuite_Add(suite,"/bson/json/read/missing_complex",test_bson_json_read_missing_complex);
  TestSuite_Add(suite,"/bson/json/read/invalid_binary",test_bson_json_read_invalid_binary);
  TestSuite_Add(suite,"/bson/json/read/invalid_json",test_bson_json_read_invalid_json);
  TestSuite_Add(suite,"/bson/json/read/bad_cb",test_bson_json_read_bad_cb);
  TestSuite_Add(suite,"/bson/json/read/invalid",test_bson_json_read_invalid);
  TestSuite_Add(suite,"/bson/json/read/raw_utf8",test_bson_json_read_raw_utf8);
  TestSuite_Add(suite,"/bson/json/read/corrupt_utf8",test_bson_json_read_corrupt_utf8);
  TestSuite_Add(suite,"/bson/json/read/decimal128",test_bson_json_read_decimal128);
  TestSuite_Add(suite,"/bson/json/read/dbpointer",test_bson_json_read_dbpointer);
  TestSuite_Add(suite,"/bson/json/read/legacy_regex",test_bson_json_read_legacy_regex);
  TestSuite_Add(suite,"/bson/json/read/regex_options_order",test_bson_json_read_regex_options_order)
  ;
  TestSuite_Add(suite,"/bson/json/read/binary",test_bson_json_read_binary);
  TestSuite_Add(suite,"/bson/json/read/legacy_binary",test_bson_json_read_legacy_binary);
  TestSuite_Add(suite,"/bson/json/read/file",test_json_reader_new_from_file);
  TestSuite_Add(suite,"/bson/json/read/bad_path",test_json_reader_new_from_bad_path);
  TestSuite_Add(suite,"/bson/json/read/$numberLong",test_bson_json_number_long);
  TestSuite_Add(suite,"/bson/json/read/$numberLong/zero",test_bson_json_number_long_zero);
  TestSuite_Add(suite,"/bson/json/read/code",test_bson_json_code);
  TestSuite_Add(suite,"/bson/json/read/code/errors",test_bson_json_code_errors);
  TestSuite_Add(suite,"/bson/json/read/dbref",test_bson_json_dbref);
  TestSuite_Add(suite,"/bson/json/read/uescape",test_bson_json_uescape);
  TestSuite_Add(suite,"/bson/json/read/uescape/key",test_bson_json_uescape_key);
  TestSuite_Add(suite,"/bson/json/read/uescape/bad",test_bson_json_uescape_bad);
  TestSuite_Add(suite,"/bson/json/read/int32",test_bson_json_int32);
  TestSuite_Add(suite,"/bson/json/read/int64",test_bson_json_int64);
  TestSuite_Add(suite,"/bson/json/read/double",test_bson_json_double);
  TestSuite_Add(suite,"/bson/json/read/double/overflow",test_bson_json_double_overflow);
  TestSuite_Add(suite,"/bson/json/read/double/nan",test_bson_json_nan);
  TestSuite_Add(suite,"/bson/json/read/double/infinity",test_bson_json_infinity);
  TestSuite_Add(suite,"/bson/json/read/null",test_bson_json_null);
  TestSuite_Add(suite,"/bson/json/read/empty_final",test_bson_json_empty_final_object);
  TestSuite_Add(suite,"/bson/as_json/decimal128",test_bson_as_json_decimal128);
  TestSuite_Add(suite,"/bson/json/read/$numberDecimal",test_bson_json_number_decimal);
  TestSuite_Add(suite,"/bson/json/errors",test_bson_json_errors);
  TestSuite_Add(suite,"/bson/integer/width",test_bson_integer_width);
  TestSuite_Add(suite,"/bson/json/read/null_in_str",test_bson_json_null_in_str);
  TestSuite_Add(suite,"/bson/as_json/multi_object",test_bson_as_json_multi_object);
  return;
}

Assistant:

static void
test_bson_iter_overwrite_bool (void)
{
   bson_iter_t iter;
   bson_t b;

   bson_init (&b);
   BSON_ASSERT (bson_append_bool (&b, "key", -1, true));
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_BOOL (&iter));
   bson_iter_overwrite_bool (&iter, false);
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_BOOL (&iter));
   BSON_ASSERT_CMPINT (bson_iter_bool (&iter), ==, false);
   bson_destroy (&b);
}